

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::DefineGroupNode::Emit(DefineGroupNode *this,Compiler *compiler,CharCount *skipped)

{
  CompilationScheme CVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  CharCount CVar5;
  CharSet<char16_t> *other;
  code *pcVar6;
  bool bVar7;
  char16 cVar8;
  undefined4 *puVar9;
  uint8 *puVar10;
  ChompSetGroupInst<(UnifiedRegex::ChompMode)1> *this_00;
  Node *pNVar11;
  uint uVar12;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  CVar1 = this->scheme;
  if (CVar1 == BeginEnd) {
    if (*skipped != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xd06,"(skipped == 0)","skipped == 0");
      if (!bVar7) {
LAB_00d14d08:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar9 = 0;
    }
    puVar10 = Compiler::Emit(compiler,5);
    iVar4 = this->groupId;
    *puVar10 = 'A';
    *(int *)(puVar10 + 1) = iVar4;
    (*this->body->_vptr_Node[0x11])(this->body,compiler,skipped);
    puVar10 = Compiler::Emit(compiler,6);
    iVar4 = this->groupId;
    bVar7 = this->noNeedToSave;
    *puVar10 = 'B';
    *(int *)(puVar10 + 1) = iVar4;
    puVar10[5] = bVar7;
  }
  else if (CVar1 == Fixed) {
    pNVar11 = this->body;
    if ((pNVar11->thisConsumes).lower != (pNVar11->thisConsumes).upper) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xcf9,"(body->thisConsumes.IsFixed())","body->thisConsumes.IsFixed()");
      if (!bVar7) goto LAB_00d14d08;
      *puVar9 = 0;
      pNVar11 = this->body;
    }
    (*pNVar11->_vptr_Node[0x11])(pNVar11,compiler,skipped);
    puVar10 = Compiler::Emit(compiler,10);
    iVar4 = this->groupId;
    CVar5 = (this->body->thisConsumes).lower;
    bVar7 = this->noNeedToSave;
    *puVar10 = 'C';
    *(int *)(puVar10 + 1) = iVar4;
    *(CharCount *)(puVar10 + 5) = CVar5;
    puVar10[9] = bVar7;
  }
  else if (CVar1 == Chomp) {
    pNVar11 = this->body;
    if (pNVar11->tag != Loop) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xcd9,"(body->tag == NodeTag::Loop)","body->tag == NodeTag::Loop");
      if (!bVar7) goto LAB_00d14d08;
      *puVar9 = 0;
      pNVar11 = this->body;
    }
    other = (CharSet<char16_t> *)pNVar11[1]._vptr_Node[2];
    uVar2._0_2_ = pNVar11[1].tag;
    uVar2._2_2_ = pNVar11[1].features;
    if ((1 < uVar2) || (*(int *)&pNVar11[1].field_0xc != -1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xcdd,"(repeats.lower <= 1 && repeats.IsUnbounded())",
                         "repeats.lower <= 1 && repeats.IsUnbounded()");
      if (!bVar7) goto LAB_00d14d08;
      *puVar9 = 0;
    }
    if ((other->rep).compact.countPlusOne != 2) {
      uVar12._0_2_ = pNVar11[1].tag;
      uVar12._2_2_ = pNVar11[1].features;
      if ((1 < uVar12) || (*(int *)&pNVar11[1].field_0xc != -1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                           ,0xce8,"(repeats.lower <= 1 && repeats.IsUnbounded())",
                           "repeats.lower <= 1 && repeats.IsUnbounded()");
        if (!bVar7) goto LAB_00d14d08;
        *puVar9 = 0;
        uVar12._0_2_ = pNVar11[1].tag;
        uVar12._2_2_ = pNVar11[1].features;
      }
      this_00 = (ChompSetGroupInst<(UnifiedRegex::ChompMode)1> *)Compiler::Emit(compiler,0x2e);
      if (uVar12 == 0) {
        ChompSetGroupInst<(UnifiedRegex::ChompMode)0>::ChompSetGroupInst
                  ((ChompSetGroupInst<(UnifiedRegex::ChompMode)0> *)this_00,this->groupId,
                   this->noNeedToSave);
      }
      else {
        ChompSetGroupInst<(UnifiedRegex::ChompMode)1>::ChompSetGroupInst
                  (this_00,this->groupId,this->noNeedToSave);
      }
      RuntimeCharSet<char16_t>::CloneFrom
                (&(this_00->super_SetMixin<false>).set,compiler->rtAllocator,other);
      return;
    }
    cVar8 = CharSet<char16_t>::Singleton(other);
    iVar4._0_2_ = pNVar11[1].tag;
    iVar4._2_2_ = pNVar11[1].features;
    puVar10 = Compiler::Emit(compiler,8);
    iVar3 = this->groupId;
    bVar7 = this->noNeedToSave;
    if (iVar4 == 0) {
      *puVar10 = 'V';
    }
    else {
      *puVar10 = 'W';
    }
    *(char16 *)(puVar10 + 1) = cVar8;
    *(int *)(puVar10 + 3) = iVar3;
    puVar10[7] = bVar7;
  }
  return;
}

Assistant:

void DefineGroupNode::Emit(Compiler& compiler, CharCount& skipped)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        switch (scheme)
        {
            case Chomp:
            {
                // Compilation scheme:
                //
                //   Chomp(Char|Set)Group
                Assert(body->tag == NodeTag::Loop);
                const LoopNode *const loop = static_cast<const LoopNode *>(body);
                const CharSet<Char> *const loopBodyFirstSet = loop->body->firstSet;
                const CountDomain &repeats = loop->repeats;
                Assert(repeats.lower <= 1 && repeats.IsUnbounded());
                if(loopBodyFirstSet->IsSingleton())
                {
                    const Char c = loopBodyFirstSet->Singleton();
                    if(repeats.lower == 0)
                        EMIT(compiler, ChompCharGroupInst<ChompMode::Star>, c, groupId, noNeedToSave);
                    else
                        EMIT(compiler, ChompCharGroupInst<ChompMode::Plus>, c, groupId, noNeedToSave);
                }
                else
                {
                    Assert(repeats.lower <= 1 && repeats.IsUnbounded());
                    RuntimeCharSet<Char> *runtimeSet;
                    if(repeats.lower == 0)
                        runtimeSet = &EMIT(compiler, ChompSetGroupInst<ChompMode::Star>, groupId, noNeedToSave)->set;
                    else
                        runtimeSet = &EMIT(compiler, ChompSetGroupInst<ChompMode::Plus>, groupId, noNeedToSave)->set;
                    runtimeSet->CloneFrom(compiler.rtAllocator, *loopBodyFirstSet);
                }
                break;
            }

            case Fixed:
            {
                // Compilation scheme:
                //
                //   <body>
                //   DefineGroup
                Assert(body->thisConsumes.IsFixed());
                body->Emit(compiler, skipped);
                EMIT(compiler, DefineGroupFixedInst, groupId, body->thisConsumes.lower, noNeedToSave);
                break;
            }

            case BeginEnd:
            {
                // Compilation scheme:
                //
                //   BeginDefineGroup
                //   <body>
                //   EndDefineGroup
                Assert(skipped == 0);
                EMIT(compiler, BeginDefineGroupInst, groupId);
                body->Emit(compiler, skipped);
                EMIT(compiler, EndDefineGroupInst, groupId, noNeedToSave);
                break;
            }
        }
    }